

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Image * GenImagePerlinNoise(Image *__return_storage_ptr__,int width,int height,int offsetX,
                           int offsetY,float scale)

{
  undefined1 uVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  int i;
  int iVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pvVar2 = malloc((long)(height * width) << 2);
  if (0 < height) {
    fVar10 = (float)width / (float)height;
    uVar4 = 0;
    do {
      if (0 < width) {
        fVar12 = (float)(offsetY + (int)uVar4) * (scale / (float)height);
        if (width <= height) {
          fVar12 = fVar12 / fVar10;
        }
        lVar3 = uVar4 * (uint)width;
        uVar6 = 0;
        do {
          fVar11 = 1.0;
          fVar7 = (float)(offsetX + (int)uVar6) * (scale / (float)width);
          if (height < width) {
            fVar7 = fVar7 * fVar10;
          }
          iVar5 = 0;
          fVar9 = 0.0;
          fVar13 = 1.0;
          do {
            fVar8 = stb_perlin_noise3_internal
                              (fVar7 * fVar11,fVar12 * fVar11,fVar11,0,0,0,(uchar)iVar5);
            fVar9 = fVar9 + fVar8 * fVar13;
            fVar11 = fVar11 + fVar11;
            fVar13 = fVar13 * 0.5;
            iVar5 = iVar5 + 1;
          } while (iVar5 != 6);
          fVar7 = -1.0;
          if (-1.0 <= fVar9) {
            fVar7 = fVar9;
          }
          fVar11 = 1.0;
          if (fVar7 <= 1.0) {
            fVar11 = fVar7;
          }
          uVar1 = (undefined1)(int)((fVar11 + 1.0) * 0.5 * 255.0);
          *(undefined1 *)((long)pvVar2 + uVar6 * 4 + lVar3 * 4) = uVar1;
          *(undefined1 *)((long)pvVar2 + uVar6 * 4 + lVar3 * 4 + 1) = uVar1;
          *(undefined1 *)((long)pvVar2 + uVar6 * 4 + lVar3 * 4 + 2) = uVar1;
          *(undefined1 *)((long)pvVar2 + uVar6 * 4 + lVar3 * 4 + 3) = 0xff;
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)width);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImagePerlinNoise(int width, int height, int offsetX, int offsetY, float scale)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    float aspectRatio = (float)width / (float)height;
    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            float nx = (float)(x + offsetX)*(scale/(float)width);
            float ny = (float)(y + offsetY)*(scale/(float)height);

            // Apply aspect ratio compensation to wider side
            if (width > height) nx *= aspectRatio;
            else ny /= aspectRatio;

            // Basic perlin noise implementation (not used)
            //float p = (stb_perlin_noise3(nx, ny, 0.0f, 0, 0, 0);

            // Calculate a better perlin noise using fbm (fractal brownian motion)
            // Typical values to start playing with:
            //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
            //   gain       =  0.5   -- relative weighting applied to each successive octave
            //   octaves    =  6     -- number of "octaves" of noise3() to sum
            float p = stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6);

            // Clamp between -1.0f and 1.0f
            if (p < -1.0f) p = -1.0f;
            if (p > 1.0f) p = 1.0f;

            // We need to normalize the data from [-1..1] to [0..1]
            float np = (p + 1.0f)/2.0f;

            int intensity = (int)(np*255.0f);
            pixels[y*width + x] = (Color){ intensity, intensity, intensity, 255 };
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}